

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstream.cpp
# Opt level: O0

void __thiscall sai::ifstream::ifstream(ifstream *this,path *Path)

{
  ifstreambuf *this_00;
  undefined1 auVar1 [12];
  span<const_unsigned_int,_256UL> local_30 [3];
  path *local_18;
  path *Path_local;
  ifstream *this_local;
  
  local_18 = Path;
  Path_local = (path *)this;
  std::ios::ios((ios *)&(this->super_istream).field_0x10);
  this_00 = (ifstreambuf *)operator_new(0x1278);
  std::span<const_unsigned_int,_256UL>::span<unsigned_int,_256UL>
            (local_30,(array<unsigned_int,_256UL> *)Keys::User);
  ifstreambuf::ifstreambuf(this_00,local_30[0]);
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__0011dc90);
  (this->super_istream)._vptr_basic_istream = (_func_int **)&PTR__ifstream_0011dc50;
  *(undefined ***)&(this->super_istream).field_0x10 = &PTR__ifstream_0011dc78;
  auVar1 = std::ios::rdbuf();
  ifstreambuf::open(auVar1._0_8_,(char *)local_18,auVar1._8_4_);
  return;
}

Assistant:

ifstream::ifstream(const std::filesystem::path& Path) : std::istream(new ifstreambuf())
{
	reinterpret_cast<ifstreambuf*>(rdbuf())->open(Path);
}